

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcEdge::IfcEdge(IfcEdge *this,void **vtt)

{
  void **vtt_local;
  IfcEdge *this_local;
  
  IfcTopologicalRepresentationItem::IfcTopologicalRepresentationItem
            (&this->super_IfcTopologicalRepresentationItem,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdge,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdge,_2UL> *)
             &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             vtt + 10);
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcVertex>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcVertex> *)
             &(this->super_IfcTopologicalRepresentationItem).field_0x30,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcVertex>::Lazy(&this->EdgeEnd,(LazyObject *)0x0);
  return;
}

Assistant:

IfcEdge() : Object("IfcEdge") {}